

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

iterator __thiscall CP::list<int>::erase(list<int> *this,iterator it)

{
  node *pnVar1;
  node *pnVar2;
  
  if (this->mCheck == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"WRONG FUNCTION CALL",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  pnVar1 = (it.ptr)->prev;
  pnVar2 = (it.ptr)->next;
  pnVar1->next = pnVar2;
  (it.ptr)->next->prev = pnVar1;
  if (it.ptr != (node *)0x0) {
    operator_delete(it.ptr,0x18);
  }
  this->mSize = this->mSize - 1;
  return (iterator)pnVar2;
}

Assistant:

iterator erase(iterator it) {
      if (mCheck) std::cout << "WRONG FUNCTION CALL" << std::endl;
      iterator tmp(it.ptr->next);
      it.ptr->prev->next = it.ptr->next;
      it.ptr->next->prev = it.ptr->prev;
      delete it.ptr;
      mSize--;
      return tmp;
    }